

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  uint uVar2;
  BigNumber *pBVar3;
  ostream *poVar4;
  char *__assertion;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double in_XMM1_Qa;
  BigNumber a;
  BigNumber c;
  BigNumber d;
  BigNumber dv1;
  BigNumber ml1;
  BigNumber sb1;
  string local_1a38;
  allocator local_1a12;
  allocator local_1a11;
  BigNumber ad1;
  string local_19f0;
  BigNumber local_19d0;
  BigNumber local_19b0;
  BigNumber local_1990;
  string local_1970;
  BigNumber local_1950;
  BigNumber local_1930;
  BigNumber local_1910;
  string local_18f0;
  BigNumber local_18d0;
  BigNumber local_18b0;
  BigNumber local_1890;
  string local_1870;
  BigNumber local_1850;
  BigNumber local_1830;
  BigNumber local_1810;
  string local_17f0;
  string local_17d0;
  string local_17b0;
  string local_1790;
  string local_1770;
  string local_1750;
  string local_1730;
  string local_1710;
  string local_16f0;
  string local_16d0;
  string local_16b0;
  string local_1690;
  string local_1670;
  string local_1650;
  string local_1630;
  string local_1610;
  string local_15f0;
  string local_15d0;
  string local_15b0;
  string local_1590;
  string local_1570;
  BigNumber local_1550;
  string local_1530;
  string local_1510;
  BigNumber local_14f0;
  string local_14d0;
  string local_14b0;
  BigNumber local_1490;
  string local_1470;
  string local_1450;
  BigNumber local_1430;
  string local_1410;
  string local_13f0;
  BigNumber local_13d0;
  string local_13b0;
  string local_1390;
  BigNumber local_1370;
  string local_1350;
  string local_1330;
  BigNumber local_1310;
  string local_12f0;
  string local_12d0;
  BigNumber local_12b0;
  string local_1290;
  string local_1270;
  BigNumber local_1250;
  string local_1230;
  string local_1210;
  BigNumber local_11f0;
  string local_11d0;
  string local_11b0;
  BigNumber local_1190;
  string local_1170;
  string local_1150;
  BigNumber local_1130;
  string local_1110;
  string local_10f0;
  BigNumber local_10d0;
  string local_10b0;
  string local_1090;
  BigNumber local_1070;
  string local_1050;
  string local_1030;
  BigNumber local_1010;
  string local_ff0;
  string local_fd0;
  BigNumber local_fb0;
  string local_f90;
  string local_f70;
  BigNumber local_f50;
  string local_f30;
  string local_f10;
  BigNumber local_ef0;
  string local_ed0;
  string local_eb0;
  BigNumber local_e90;
  string local_e70;
  string local_e50;
  BigNumber local_e30;
  string local_e10;
  string local_df0;
  BigNumber local_dd0;
  string local_db0;
  string local_d90;
  BigNumber local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  string local_c90;
  BigNumber local_c70;
  BigNumber local_c50;
  BigNumber local_c30;
  BigNumber local_c10;
  BigNumber local_bf0;
  BigNumber local_bd0;
  BigNumber local_bb0;
  string local_b90;
  BigNumber local_b70;
  string local_b50;
  BigNumber local_b30;
  string local_b10;
  BigNumber local_af0;
  string local_ad0;
  BigNumber local_ab0;
  string local_a90;
  BigNumber local_a70;
  string local_a50;
  BigNumber local_a30;
  BigNumber local_a10;
  BigNumber local_9f0;
  BigNumber local_9d0;
  BigNumber local_9b0;
  string local_990;
  string local_970;
  BigNumber local_950;
  string local_930;
  string local_910;
  BigNumber local_8f0;
  string local_8d0;
  string local_8b0;
  BigNumber local_890;
  string local_870;
  string local_850;
  BigNumber local_830;
  string local_810;
  string local_7f0;
  BigNumber local_7d0;
  string local_7b0;
  string local_790;
  BigNumber local_770;
  BigNumber local_750;
  BigNumber local_730;
  BigNumber local_710;
  BigNumber local_6f0;
  string local_6d0;
  string local_6b0;
  BigNumber local_690;
  BigNumber local_670;
  string local_650;
  string local_630;
  BigNumber local_610;
  BigNumber local_5f0;
  string local_5d0;
  string local_5b0;
  BigNumber local_590;
  string local_570;
  string local_550;
  BigNumber local_530;
  string local_510;
  string local_4f0;
  BigNumber local_4d0;
  string local_4b0;
  string local_490;
  BigNumber local_470;
  string local_450;
  string local_430;
  BigNumber local_410;
  string local_3f0;
  string local_3d0;
  BigNumber local_3b0;
  string local_390;
  string local_370;
  BigNumber local_350;
  string local_330;
  string local_310;
  BigNumber local_2f0;
  BigNumber local_2d0;
  string local_2b0;
  BigNumber local_290;
  BigNumber local_270;
  BigNumber local_250;
  string local_230;
  string local_210;
  BigNumber local_1f0;
  string local_1d0;
  string local_1b0;
  BigNumber local_190;
  string local_170;
  string local_150;
  BigNumber local_130;
  string local_110;
  string local_f0;
  BigNumber local_d0;
  BigNumber local_b0;
  BigNumber local_90;
  BigNumber local_70;
  BigNumber local_50;
  BigNumber local_30;
  
  BigNumber::BigNumber(&local_90,0x32);
  BigNumber::BigNumber(&ml1,0x20);
  operator+(&sb1,&local_90,&ml1);
  BigNumber::getString_abi_cxx11_(&ad1._numberString,&sb1);
  bVar1 = std::operator==(&ad1._numberString,"82");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&ad1);
    std::__cxx11::string::~string((string *)&sb1);
    std::__cxx11::string::~string((string *)&ml1);
    std::__cxx11::string::~string((string *)&local_90);
    BigNumber::BigNumber(&local_b0,5);
    BigNumber::BigNumber(&ml1,0x26e);
    operator+(&sb1,&local_b0,&ml1);
    BigNumber::getString_abi_cxx11_(&ad1._numberString,&sb1);
    bVar1 = std::operator==(&ad1._numberString,"627");
    if (bVar1) {
      std::__cxx11::string::~string((string *)&ad1);
      std::__cxx11::string::~string((string *)&sb1);
      std::__cxx11::string::~string((string *)&ml1);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string((string *)&local_f0,"-33",(allocator *)&dv1);
      BigNumber::BigNumber(&local_d0,&local_f0);
      std::__cxx11::string::string((string *)&local_110,"8",(allocator *)&a);
      BigNumber::BigNumber(&ml1,&local_110);
      operator+(&sb1,&local_d0,&ml1);
      BigNumber::getString_abi_cxx11_(&ad1._numberString,&sb1);
      bVar1 = std::operator==(&ad1._numberString,"-25");
      if (bVar1) {
        std::__cxx11::string::~string((string *)&ad1);
        std::__cxx11::string::~string((string *)&sb1);
        std::__cxx11::string::~string((string *)&ml1);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::string((string *)&local_150,"15535",(allocator *)&dv1);
        BigNumber::BigNumber(&local_130,&local_150);
        std::__cxx11::string::string((string *)&local_170,"0",(allocator *)&a);
        BigNumber::BigNumber(&ml1,&local_170);
        operator+(&sb1,&local_130,&ml1);
        BigNumber::getString_abi_cxx11_(&ad1._numberString,&sb1);
        bVar1 = std::operator==(&ad1._numberString,"15535");
        if (bVar1) {
          std::__cxx11::string::~string((string *)&ad1);
          std::__cxx11::string::~string((string *)&sb1);
          std::__cxx11::string::~string((string *)&ml1);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::string((string *)&local_1b0,"126",(allocator *)&dv1);
          BigNumber::BigNumber(&local_190,&local_1b0);
          std::__cxx11::string::string((string *)&local_1d0,"39285",(allocator *)&a);
          BigNumber::BigNumber(&ml1,&local_1d0);
          operator+(&sb1,&local_190,&ml1);
          BigNumber::getString_abi_cxx11_(&ad1._numberString,&sb1);
          bVar1 = std::operator==(&ad1._numberString,"39411");
          if (bVar1) {
            std::__cxx11::string::~string((string *)&ad1);
            std::__cxx11::string::~string((string *)&sb1);
            std::__cxx11::string::~string((string *)&ml1);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::string((string *)&local_210,"0",(allocator *)&dv1);
            BigNumber::BigNumber(&local_1f0,&local_210);
            std::__cxx11::string::string((string *)&local_230,"0",(allocator *)&a);
            BigNumber::BigNumber(&ml1,&local_230);
            operator+(&sb1,&local_1f0,&ml1);
            BigNumber::getString_abi_cxx11_(&ad1._numberString,&sb1);
            bVar1 = std::operator==(&ad1._numberString,"0");
            if (bVar1) {
              std::__cxx11::string::~string((string *)&ad1);
              std::__cxx11::string::~string((string *)&sb1);
              std::__cxx11::string::~string((string *)&ml1);
              std::__cxx11::string::~string((string *)&local_230);
              std::__cxx11::string::~string((string *)&local_1f0);
              std::__cxx11::string::~string((string *)&local_210);
              BigNumber::BigNumber(&local_70,5);
              ad1._numberString._M_dataplus._M_p = (pointer)0xa;
              operator+(&local_250,&local_70,(longlong *)&ad1);
              sb1._numberString._M_dataplus._M_p = (pointer)0xf;
              bVar1 = operator==(&local_250,(longlong *)&sb1);
              if (bVar1) {
                std::__cxx11::string::~string((string *)&local_250);
                std::__cxx11::string::~string((string *)&local_70);
                std::__cxx11::string::string((string *)&local_2b0,"-41",(allocator *)&ml1);
                BigNumber::BigNumber(&local_290,&local_2b0);
                ad1._numberString._M_dataplus._M_p = (pointer)0x28;
                operator+(&local_270,&local_290,(longlong *)&ad1);
                sb1._numberString._M_dataplus._M_p = (pointer)0xffffffffffffffff;
                bVar1 = operator==(&local_270,(longlong *)&sb1);
                if (bVar1) {
                  std::__cxx11::string::~string((string *)&local_270);
                  std::__cxx11::string::~string((string *)&local_290);
                  std::__cxx11::string::~string((string *)&local_2b0);
                  BigNumber::BigNumber(&ad1,600);
                  sb1._numberString._M_dataplus._M_p = (pointer)0x32;
                  BigNumber::operator+=(&ad1,(longlong *)&sb1);
                  std::__cxx11::string::string((string *)&sb1,"50",(allocator *)&ml1);
                  BigNumber::operator+=(&ad1,&sb1._numberString);
                  std::__cxx11::string::~string((string *)&sb1);
                  BigNumber::getString_abi_cxx11_(&sb1._numberString,&ad1);
                  bVar1 = std::operator==(&sb1._numberString,"700");
                  if (bVar1) {
                    std::__cxx11::string::~string((string *)&sb1);
                    std::__cxx11::string::string((string *)&local_2d0,(string *)&ad1);
                    sb1._numberString._M_dataplus._M_p = (pointer)0x2bc;
                    bVar1 = operator==(&local_2d0,(longlong *)&sb1);
                    if (bVar1) {
                      std::__cxx11::string::~string((string *)&local_2d0);
                      std::__cxx11::string::string((string *)&local_310,"50",(allocator *)&a);
                      BigNumber::BigNumber(&local_2f0,&local_310);
                      std::__cxx11::string::string((string *)&local_330,"32",(allocator *)&c);
                      BigNumber::BigNumber(&dv1,&local_330);
                      operator-(&ml1,&local_2f0,&dv1);
                      BigNumber::getString_abi_cxx11_(&sb1._numberString,&ml1);
                      bVar1 = std::operator==(&sb1._numberString,"18");
                      if (bVar1) {
                        std::__cxx11::string::~string((string *)&sb1);
                        std::__cxx11::string::~string((string *)&ml1);
                        std::__cxx11::string::~string((string *)&dv1);
                        std::__cxx11::string::~string((string *)&local_330);
                        std::__cxx11::string::~string((string *)&local_2f0);
                        std::__cxx11::string::~string((string *)&local_310);
                        std::__cxx11::string::string((string *)&local_370,"50",(allocator *)&a);
                        BigNumber::BigNumber(&local_350,&local_370);
                        std::__cxx11::string::string((string *)&local_390,"60",(allocator *)&c);
                        BigNumber::BigNumber(&dv1,&local_390);
                        operator-(&ml1,&local_350,&dv1);
                        BigNumber::getString_abi_cxx11_(&sb1._numberString,&ml1);
                        bVar1 = std::operator==(&sb1._numberString,"-10");
                        if (bVar1) {
                          std::__cxx11::string::~string((string *)&sb1);
                          std::__cxx11::string::~string((string *)&ml1);
                          std::__cxx11::string::~string((string *)&dv1);
                          std::__cxx11::string::~string((string *)&local_390);
                          std::__cxx11::string::~string((string *)&local_350);
                          std::__cxx11::string::~string((string *)&local_370);
                          std::__cxx11::string::string((string *)&local_3d0,"0",(allocator *)&a);
                          BigNumber::BigNumber(&local_3b0,&local_3d0);
                          std::__cxx11::string::string((string *)&local_3f0,"46",(allocator *)&c);
                          BigNumber::BigNumber(&dv1,&local_3f0);
                          operator-(&ml1,&local_3b0,&dv1);
                          BigNumber::getString_abi_cxx11_(&sb1._numberString,&ml1);
                          bVar1 = std::operator==(&sb1._numberString,"-46");
                          if (bVar1) {
                            std::__cxx11::string::~string((string *)&sb1);
                            std::__cxx11::string::~string((string *)&ml1);
                            std::__cxx11::string::~string((string *)&dv1);
                            std::__cxx11::string::~string((string *)&local_3f0);
                            std::__cxx11::string::~string((string *)&local_3b0);
                            std::__cxx11::string::~string((string *)&local_3d0);
                            std::__cxx11::string::string((string *)&local_430,"50",(allocator *)&a);
                            BigNumber::BigNumber(&local_410,&local_430);
                            std::__cxx11::string::string((string *)&local_450,"50",(allocator *)&c);
                            BigNumber::BigNumber(&dv1,&local_450);
                            operator-(&ml1,&local_410,&dv1);
                            BigNumber::getString_abi_cxx11_(&sb1._numberString,&ml1);
                            bVar1 = std::operator==(&sb1._numberString,"0");
                            if (bVar1) {
                              std::__cxx11::string::~string((string *)&sb1);
                              std::__cxx11::string::~string((string *)&ml1);
                              std::__cxx11::string::~string((string *)&dv1);
                              std::__cxx11::string::~string((string *)&local_450);
                              std::__cxx11::string::~string((string *)&local_410);
                              std::__cxx11::string::~string((string *)&local_430);
                              std::__cxx11::string::string
                                        ((string *)&local_490,"482847",(allocator *)&a);
                              BigNumber::BigNumber(&local_470,&local_490);
                              std::__cxx11::string::string
                                        ((string *)&local_4b0,"89787941",(allocator *)&c);
                              BigNumber::BigNumber(&dv1,&local_4b0);
                              operator-(&ml1,&local_470,&dv1);
                              BigNumber::getString_abi_cxx11_(&sb1._numberString,&ml1);
                              bVar1 = std::operator==(&sb1._numberString,"-89305094");
                              if (bVar1) {
                                std::__cxx11::string::~string((string *)&sb1);
                                std::__cxx11::string::~string((string *)&ml1);
                                std::__cxx11::string::~string((string *)&dv1);
                                std::__cxx11::string::~string((string *)&local_4b0);
                                std::__cxx11::string::~string((string *)&local_470);
                                std::__cxx11::string::~string((string *)&local_490);
                                std::__cxx11::string::string
                                          ((string *)&local_4f0,"6828",(allocator *)&a);
                                BigNumber::BigNumber(&local_4d0,&local_4f0);
                                std::__cxx11::string::string
                                          ((string *)&local_510,"1",(allocator *)&c);
                                BigNumber::BigNumber(&dv1,&local_510);
                                operator-(&ml1,&local_4d0,&dv1);
                                BigNumber::getString_abi_cxx11_(&sb1._numberString,&ml1);
                                bVar1 = std::operator==(&sb1._numberString,"6827");
                                if (bVar1) {
                                  std::__cxx11::string::~string((string *)&sb1);
                                  std::__cxx11::string::~string((string *)&ml1);
                                  std::__cxx11::string::~string((string *)&dv1);
                                  std::__cxx11::string::~string((string *)&local_510);
                                  std::__cxx11::string::~string((string *)&local_4d0);
                                  std::__cxx11::string::~string((string *)&local_4f0);
                                  std::__cxx11::string::string
                                            ((string *)&local_550,"100",(allocator *)&a);
                                  BigNumber::BigNumber(&local_530,&local_550);
                                  std::__cxx11::string::string
                                            ((string *)&local_570,"50",(allocator *)&c);
                                  BigNumber::BigNumber(&dv1,&local_570);
                                  operator-(&ml1,&local_530,&dv1);
                                  BigNumber::getString_abi_cxx11_(&sb1._numberString,&ml1);
                                  bVar1 = std::operator==(&sb1._numberString,"50");
                                  if (bVar1) {
                                    std::__cxx11::string::~string((string *)&sb1);
                                    std::__cxx11::string::~string((string *)&ml1);
                                    std::__cxx11::string::~string((string *)&dv1);
                                    std::__cxx11::string::~string((string *)&local_570);
                                    std::__cxx11::string::~string((string *)&local_530);
                                    std::__cxx11::string::~string((string *)&local_550);
                                    std::__cxx11::string::string
                                              ((string *)&local_5b0,"42",(allocator *)&a);
                                    BigNumber::BigNumber(&local_590,&local_5b0);
                                    std::__cxx11::string::string
                                              ((string *)&local_5d0,"49",(allocator *)&c);
                                    BigNumber::BigNumber(&dv1,&local_5d0);
                                    operator-(&ml1,&local_590,&dv1);
                                    BigNumber::getString_abi_cxx11_(&sb1._numberString,&ml1);
                                    bVar1 = std::operator==(&sb1._numberString,"-7");
                                    if (bVar1) {
                                      std::__cxx11::string::~string((string *)&sb1);
                                      std::__cxx11::string::~string((string *)&ml1);
                                      std::__cxx11::string::~string((string *)&dv1);
                                      std::__cxx11::string::~string((string *)&local_5d0);
                                      std::__cxx11::string::~string((string *)&local_590);
                                      std::__cxx11::string::~string((string *)&local_5b0);
                                      std::__cxx11::string::string
                                                ((string *)&local_630,"100",(allocator *)&dv1);
                                      BigNumber::BigNumber(&local_610,&local_630);
                                      std::__cxx11::string::string
                                                ((string *)&local_650,"5",(allocator *)&a);
                                      BigNumber::BigNumber(&sb1,&local_650);
                                      operator-(&local_5f0,&local_610,&sb1);
                                      ml1._numberString._M_dataplus._M_p = (pointer)0x5f;
                                      bVar1 = operator==(&local_5f0,(longlong *)&ml1);
                                      if (bVar1) {
                                        std::__cxx11::string::~string((string *)&local_5f0);
                                        std::__cxx11::string::~string((string *)&sb1);
                                        std::__cxx11::string::~string((string *)&local_650);
                                        std::__cxx11::string::~string((string *)&local_610);
                                        std::__cxx11::string::~string((string *)&local_630);
                                        std::__cxx11::string::string
                                                  ((string *)&local_6b0,"-100",(allocator *)&dv1);
                                        BigNumber::BigNumber(&local_690,&local_6b0);
                                        std::__cxx11::string::string
                                                  ((string *)&local_6d0,"-5",(allocator *)&a);
                                        BigNumber::BigNumber(&sb1,&local_6d0);
                                        operator-(&local_670,&local_690,&sb1);
                                        ml1._numberString._M_dataplus._M_p =
                                             (pointer)0xffffffffffffffa1;
                                        bVar1 = operator==(&local_670,(longlong *)&ml1);
                                        if (bVar1) {
                                          std::__cxx11::string::~string((string *)&local_670);
                                          std::__cxx11::string::~string((string *)&sb1);
                                          std::__cxx11::string::~string((string *)&local_6d0);
                                          std::__cxx11::string::~string((string *)&local_690);
                                          std::__cxx11::string::~string((string *)&local_6b0);
                                          BigNumber::BigNumber(&sb1,200);
                                          ml1._numberString._M_dataplus._M_p = (pointer)0x28;
                                          BigNumber::operator-=(&sb1,(longlong *)&ml1);
                                          std::__cxx11::string::string
                                                    ((string *)&local_6f0,(string *)&sb1);
                                          ml1._numberString._M_dataplus._M_p = (pointer)0xa0;
                                          bVar1 = operator==(&local_6f0,(longlong *)&ml1);
                                          if (bVar1) {
                                            std::__cxx11::string::~string((string *)&local_6f0);
                                            std::__cxx11::string::string
                                                      ((string *)&local_710,(string *)&sb1);
                                            dv1._numberString._M_dataplus._M_p = (pointer)0xb4;
                                            operator-(&ml1,&local_710,(longlong *)&dv1);
                                            BigNumber::operator=(&sb1,&ml1);
                                            std::__cxx11::string::~string((string *)&ml1);
                                            std::__cxx11::string::~string((string *)&local_710);
                                            std::__cxx11::string::string
                                                      ((string *)&local_730,(string *)&sb1);
                                            std::__cxx11::string::string
                                                      ((string *)&ml1,"-20",(allocator *)&dv1);
                                            bVar1 = operator==(&local_730,&ml1._numberString);
                                            if (bVar1) {
                                              std::__cxx11::string::~string((string *)&ml1);
                                              std::__cxx11::string::~string((string *)&local_730);
                                              std::__cxx11::string::string
                                                        ((string *)&ml1,"20",(allocator *)&dv1);
                                              BigNumber::operator-=(&sb1,&ml1._numberString);
                                              std::__cxx11::string::~string((string *)&ml1);
                                              std::__cxx11::string::string
                                                        ((string *)&local_750,(string *)&sb1);
                                              BigNumber::BigNumber(&ml1,-0x28);
                                              bVar1 = operator==(&local_750,&ml1);
                                              if (bVar1) {
                                                std::__cxx11::string::~string((string *)&ml1);
                                                std::__cxx11::string::~string((string *)&local_750);
                                                std::__cxx11::string::string
                                                          ((string *)&local_790,"4",(allocator *)&c)
                                                ;
                                                BigNumber::BigNumber(&local_770,&local_790);
                                                std::__cxx11::string::string
                                                          ((string *)&local_7b0,"12",(allocator *)&d
                                                          );
                                                BigNumber::BigNumber(&a,&local_7b0);
                                                operator*(&dv1,&local_770,&a);
                                                BigNumber::getString_abi_cxx11_
                                                          (&ml1._numberString,&dv1);
                                                bVar1 = std::operator==(&ml1._numberString,"48");
                                                if (bVar1) {
                                                  std::__cxx11::string::~string((string *)&ml1);
                                                  std::__cxx11::string::~string((string *)&dv1);
                                                  std::__cxx11::string::~string((string *)&a);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_7b0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_770);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_790);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_7f0,"3002",
                                                             (allocator *)&c);
                                                  BigNumber::BigNumber(&local_7d0,&local_7f0);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_810,"1",
                                                             (allocator *)&d);
                                                  BigNumber::BigNumber(&a,&local_810);
                                                  operator*(&dv1,&local_7d0,&a);
                                                  BigNumber::getString_abi_cxx11_
                                                            (&ml1._numberString,&dv1);
                                                  bVar1 = std::operator==(&ml1._numberString,"3002")
                                                  ;
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string((string *)&ml1);
                                                    std::__cxx11::string::~string((string *)&dv1);
                                                    std::__cxx11::string::~string((string *)&a);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_810);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_7d0);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_7f0);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_850,"99",
                                                               (allocator *)&c);
                                                    BigNumber::BigNumber(&local_830,&local_850);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_870,"0",
                                                               (allocator *)&d);
                                                    BigNumber::BigNumber(&a,&local_870);
                                                    operator*(&dv1,&local_830,&a);
                                                    BigNumber::getString_abi_cxx11_
                                                              (&ml1._numberString,&dv1);
                                                    bVar1 = std::operator==(&ml1._numberString,"0");
                                                    if (bVar1) {
                                                      std::__cxx11::string::~string((string *)&ml1);
                                                      std::__cxx11::string::~string((string *)&dv1);
                                                      std::__cxx11::string::~string((string *)&a);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_870);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_830);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_850);
                                                      std::__cxx11::string::string
                                                                ((string *)&local_8b0,"-5",
                                                                 (allocator *)&c);
                                                      BigNumber::BigNumber(&local_890,&local_8b0);
                                                      std::__cxx11::string::string
                                                                ((string *)&local_8d0,"5",
                                                                 (allocator *)&d);
                                                      BigNumber::BigNumber(&a,&local_8d0);
                                                      operator*(&dv1,&local_890,&a);
                                                      BigNumber::getString_abi_cxx11_
                                                                (&ml1._numberString,&dv1);
                                                      bVar1 = std::operator==(&ml1._numberString,
                                                                              "-25");
                                                      if (bVar1) {
                                                        std::__cxx11::string::~string
                                                                  ((string *)&ml1);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&dv1);
                                                        std::__cxx11::string::~string((string *)&a);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_8d0);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_890);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_8b0);
                                                        std::__cxx11::string::string
                                                                  ((string *)&local_910,"-33",
                                                                   (allocator *)&c);
                                                        BigNumber::BigNumber(&local_8f0,&local_910);
                                                        std::__cxx11::string::string
                                                                  ((string *)&local_930,"-2",
                                                                   (allocator *)&d);
                                                        BigNumber::BigNumber(&a,&local_930);
                                                        operator*(&dv1,&local_8f0,&a);
                                                        BigNumber::getString_abi_cxx11_
                                                                  (&ml1._numberString,&dv1);
                                                        bVar1 = std::operator==(&ml1._numberString,
                                                                                "66");
                                                        if (bVar1) {
                                                          std::__cxx11::string::~string
                                                                    ((string *)&ml1);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&dv1);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&a);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_930);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_8f0);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_910);
                                                          std::__cxx11::string::string
                                                                    ((string *)&local_970,"283",
                                                                     (allocator *)&c);
                                                          BigNumber::BigNumber
                                                                    (&local_950,&local_970);
                                                          std::__cxx11::string::string
                                                                    ((string *)&local_990,"382871",
                                                                     (allocator *)&d);
                                                          BigNumber::BigNumber(&a,&local_990);
                                                          operator*(&dv1,&local_950,&a);
                                                          BigNumber::getString_abi_cxx11_
                                                                    (&ml1._numberString,&dv1);
                                                          bVar1 = std::operator==(&ml1._numberString
                                                                                  ,"108352493");
                                                          if (bVar1) {
                                                            std::__cxx11::string::~string
                                                                      ((string *)&ml1);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&dv1);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&a);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_990);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_950);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_970);
                                                            BigNumber::BigNumber(&ml1,4);
                                                            dv1._numberString._M_dataplus._M_p =
                                                                 (pointer)0x6;
                                                            BigNumber::operator*=
                                                                      (&ml1,(longlong *)&dv1);
                                                            std::__cxx11::string::string
                                                                      ((string *)&local_9b0,
                                                                       (string *)&ml1);
                                                            std::__cxx11::string::string
                                                                      ((string *)&dv1,"24",
                                                                       (allocator *)&a);
                                                            bVar1 = operator==(&local_9b0,
                                                                               &dv1._numberString);
                                                            if (bVar1) {
                                                              std::__cxx11::string::~string
                                                                        ((string *)&dv1);
                                                              std::__cxx11::string::~string
                                                                        ((string *)&local_9b0);
                                                              BigNumber::BigNumber(&local_9d0,5);
                                                              a._numberString._M_dataplus._M_p =
                                                                   (pointer)0x6;
                                                              operator*(&dv1,&local_9d0,
                                                                        (longlong *)&a);
                                                              BigNumber::operator=(&ml1,&dv1);
                                                              std::__cxx11::string::~string
                                                                        ((string *)&dv1);
                                                              std::__cxx11::string::~string
                                                                        ((string *)&local_9d0);
                                                              std::__cxx11::string::string
                                                                        ((string *)&local_9f0,
                                                                         (string *)&ml1);
                                                              dv1._numberString._M_dataplus._M_p =
                                                                   (pointer)0x1e;
                                                              bVar1 = operator==(&local_9f0,
                                                                                 (longlong *)&dv1);
                                                              if (bVar1) {
                                                                std::__cxx11::string::~string
                                                                          ((string *)&local_9f0);
                                                                std::__cxx11::string::string
                                                                          ((string *)&dv1,"5000",
                                                                           (allocator *)&a);
                                                                BigNumber::operator*=
                                                                          (&ml1,&dv1._numberString);
                                                                std::__cxx11::string::~string
                                                                          ((string *)&dv1);
                                                                std::__cxx11::string::string
                                                                          ((string *)&local_a10,
                                                                           (string *)&ml1);
                                                                dv1._numberString._M_dataplus._M_p =
                                                                     (pointer)0x249f0;
                                                                bVar1 = operator==(&local_a10,
                                                                                   (longlong *)&dv1)
                                                                ;
                                                                if (bVar1) {
                                                                  std::__cxx11::string::~string
                                                                            ((string *)&local_a10);
                                                                  std::__cxx11::string::string
                                                                            ((string *)&local_a50,
                                                                             "25",(allocator *)&c);
                                                                  BigNumber::BigNumber
                                                                            (&dv1,&local_a50);
                                                                  std::__cxx11::string::string
                                                                            ((string *)&local_a90,
                                                                             "5",(allocator *)&d);
                                                                  BigNumber::BigNumber
                                                                            (&local_a70,&local_a90);
                                                                  BigNumber::divide(&local_a30,&dv1,
                                                                                    &local_a70);
                                                                  a._numberString._M_dataplus._M_p =
                                                                       (pointer)0x5;
                                                                  bVar1 = operator==(&local_a30,
                                                                                     (longlong *)&a)
                                                                  ;
                                                                  if (bVar1) {
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&local_a30)
                                                                    ;
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&local_a70)
                                                                    ;
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&local_a90)
                                                                    ;
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&dv1);
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&local_a50)
                                                                    ;
                                                                    std::__cxx11::string::string
                                                                              ((string *)&local_ad0,
                                                                               "48",(allocator *)&c)
                                                                    ;
                                                                    BigNumber::BigNumber
                                                                              (&dv1,&local_ad0);
                                                                    std::__cxx11::string::string
                                                                              ((string *)&local_b10,
                                                                               "6",(allocator *)&d);
                                                                    BigNumber::BigNumber
                                                                              (&local_af0,&local_b10
                                                                              );
                                                                    BigNumber::divide(&local_ab0,
                                                                                      &dv1,&
                                                  local_af0);
                                                  a._numberString._M_dataplus._M_p = (pointer)0x8;
                                                  bVar1 = operator==(&local_ab0,(longlong *)&a);
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_ab0);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_af0);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_b10);
                                                    std::__cxx11::string::~string((string *)&dv1);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_ad0);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_b50,"100",
                                                               (allocator *)&c);
                                                    BigNumber::BigNumber(&dv1,&local_b50);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_b90,"5",
                                                               (allocator *)&d);
                                                    BigNumber::BigNumber(&local_b70,&local_b90);
                                                    BigNumber::divide(&local_b30,&dv1,&local_b70);
                                                    a._numberString._M_dataplus._M_p = (pointer)0x14
                                                    ;
                                                    bVar1 = operator==(&local_b30,(longlong *)&a);
                                                    if (bVar1) {
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_b30);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_b70);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_b90);
                                                      std::__cxx11::string::~string((string *)&dv1);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_b50);
                                                      BigNumber::BigNumber(&dv1,100);
                                                      a._numberString._M_dataplus._M_p =
                                                           (pointer)0x19;
                                                      BigNumber::operator/=(&dv1,(longlong *)&a);
                                                      std::__cxx11::string::string
                                                                ((string *)&local_bb0,(string *)&dv1
                                                                );
                                                      a._numberString._M_dataplus._M_p =
                                                           (pointer)0x4;
                                                      bVar1 = operator==(&local_bb0,(longlong *)&a);
                                                      if (bVar1) {
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_bb0);
                                                        std::__cxx11::string::string
                                                                  ((string *)&local_bd0,
                                                                   (string *)&dv1);
                                                        operator/(&a,&local_bd0,&dv1);
                                                        BigNumber::operator=(&dv1,&a);
                                                        std::__cxx11::string::~string((string *)&a);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_bd0);
                                                        std::__cxx11::string::string
                                                                  ((string *)&local_bf0,
                                                                   (string *)&dv1);
                                                        a._numberString._M_dataplus._M_p =
                                                             (pointer)0x1;
                                                        bVar1 = operator==(&local_bf0,(longlong *)&a
                                                                          );
                                                        if (bVar1) {
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_bf0);
                                                          a._numberString._M_dataplus._M_p =
                                                               (pointer)0x1;
                                                          BigNumber::operator/=(&dv1,(longlong *)&a)
                                                          ;
                                                          std::__cxx11::string::string
                                                                    ((string *)&local_c10,
                                                                     (string *)&dv1);
                                                          a._numberString._M_dataplus._M_p =
                                                               (pointer)0x1;
                                                          bVar1 = operator==(&local_c10,
                                                                             (longlong *)&a);
                                                          if (bVar1) {
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_c10);
                                                            a._numberString._M_dataplus._M_p =
                                                                 (pointer)0xfffffffffffffffb;
                                                            BigNumber::operator=
                                                                      (&dv1,(longlong *)&a);
                                                            a._numberString._M_dataplus._M_p =
                                                                 (pointer)0x5;
                                                            BigNumber::operator/=
                                                                      (&dv1,(longlong *)&a);
                                                            std::__cxx11::string::string
                                                                      ((string *)&local_c30,
                                                                       (string *)&dv1);
                                                            a._numberString._M_dataplus._M_p =
                                                                 (pointer)0xffffffffffffffff;
                                                            bVar1 = operator==(&local_c30,
                                                                               (longlong *)&a);
                                                            if (bVar1) {
                                                              std::__cxx11::string::~string
                                                                        ((string *)&local_c30);
                                                              a._numberString._M_dataplus._M_p =
                                                                   (pointer)0xbb8;
                                                              BigNumber::operator=
                                                                        (&dv1,(longlong *)&a);
                                                              a._numberString._M_dataplus._M_p =
                                                                   (pointer)0x12c;
                                                              BigNumber::operator/=
                                                                        (&dv1,(longlong *)&a);
                                                              std::__cxx11::string::string
                                                                        ((string *)&local_c50,
                                                                         (string *)&dv1);
                                                              a._numberString._M_dataplus._M_p =
                                                                   (pointer)0xa;
                                                              bVar1 = operator==(&local_c50,
                                                                                 (longlong *)&a);
                                                              if (bVar1) {
                                                                std::__cxx11::string::~string
                                                                          ((string *)&local_c50);
                                                                a._numberString._M_dataplus._M_p =
                                                                     (pointer)0x638d;
                                                                BigNumber::operator=
                                                                          (&dv1,(longlong *)&a);
                                                                a._numberString._M_dataplus._M_p =
                                                                     (pointer)0x5;
                                                                BigNumber::operator/=
                                                                          (&dv1,(longlong *)&a);
                                                                std::__cxx11::string::string
                                                                          ((string *)&local_c70,
                                                                           (string *)&dv1);
                                                                std::__cxx11::string::string
                                                                          ((string *)&a,"5097",
                                                                           (allocator *)&c);
                                                                bVar1 = operator==(&local_c70,
                                                                                   &a._numberString)
                                                                ;
                                                                if (bVar1) {
                                                                  std::__cxx11::string::~string
                                                                            ((string *)&a);
                                                                  std::__cxx11::string::~string
                                                                            ((string *)&local_c70);
                                                                  std::__cxx11::string::string
                                                                            ((string *)&local_c90,
                                                                             "2",(allocator *)
                                                                                 &local_1a38);
                                                                  BigNumber::BigNumber
                                                                            (&d,&local_c90);
                                                                  BigNumber::pow(&c,__x,in_XMM1_Qa);
                                                                  BigNumber::getString_abi_cxx11_
                                                                            (&a._numberString,&c);
                                                                  bVar1 = std::operator==(&a.
                                                  _numberString,"8");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string((string *)&a);
                                                    std::__cxx11::string::~string((string *)&c);
                                                    std::__cxx11::string::~string((string *)&d);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_c90);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_cb0,"1",
                                                               (allocator *)&local_1a38);
                                                    BigNumber::BigNumber(&d,&local_cb0);
                                                    BigNumber::pow(&c,__x_00,in_XMM1_Qa);
                                                    BigNumber::getString_abi_cxx11_
                                                              (&a._numberString,&c);
                                                    bVar1 = std::operator==(&a._numberString,"1");
                                                    if (bVar1) {
                                                      std::__cxx11::string::~string((string *)&a);
                                                      std::__cxx11::string::~string((string *)&c);
                                                      std::__cxx11::string::~string((string *)&d);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_cb0);
                                                      std::__cxx11::string::string
                                                                ((string *)&local_cd0,"5",
                                                                 (allocator *)&local_1a38);
                                                      BigNumber::BigNumber(&d,&local_cd0);
                                                      BigNumber::pow(&c,__x_01,in_XMM1_Qa);
                                                      BigNumber::getString_abi_cxx11_
                                                                (&a._numberString,&c);
                                                      bVar1 = std::operator==(&a._numberString,"25")
                                                      ;
                                                      if (bVar1) {
                                                        std::__cxx11::string::~string((string *)&a);
                                                        std::__cxx11::string::~string((string *)&c);
                                                        std::__cxx11::string::~string((string *)&d);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_cd0);
                                                        std::__cxx11::string::string
                                                                  ((string *)&local_cf0,"10",
                                                                   (allocator *)&local_1a38);
                                                        BigNumber::BigNumber(&d,&local_cf0);
                                                        BigNumber::pow(&c,__x_02,in_XMM1_Qa);
                                                        BigNumber::getString_abi_cxx11_
                                                                  (&a._numberString,&c);
                                                        bVar1 = std::operator==(&a._numberString,
                                                                                "10000000000");
                                                        if (bVar1) {
                                                          std::__cxx11::string::~string
                                                                    ((string *)&a);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&c);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&d);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_cf0);
                                                          std::__cxx11::string::string
                                                                    ((string *)&local_d10,"5",
                                                                     (allocator *)&local_1a38);
                                                          BigNumber::BigNumber(&d,&local_d10);
                                                          BigNumber::pow(&c,__x_03,in_XMM1_Qa);
                                                          BigNumber::getString_abi_cxx11_
                                                                    (&a._numberString,&c);
                                                          bVar1 = std::operator==(&a._numberString,
                                                                                  "5");
                                                          if (bVar1) {
                                                            std::__cxx11::string::~string
                                                                      ((string *)&a);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&c);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&d);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_d10);
                                                            std::__cxx11::string::string
                                                                      ((string *)&local_d30,"5",
                                                                       (allocator *)&local_1a38);
                                                            BigNumber::BigNumber(&d,&local_d30);
                                                            BigNumber::pow(&c,__x_04,in_XMM1_Qa);
                                                            BigNumber::getString_abi_cxx11_
                                                                      (&a._numberString,&c);
                                                            bVar1 = std::operator==(&a._numberString
                                                                                    ,"1");
                                                            if (bVar1) {
                                                              std::__cxx11::string::~string
                                                                        ((string *)&a);
                                                              std::__cxx11::string::~string
                                                                        ((string *)&c);
                                                              std::__cxx11::string::~string
                                                                        ((string *)&d);
                                                              std::__cxx11::string::~string
                                                                        ((string *)&local_d30);
                                                              std::__cxx11::string::string
                                                                        ((string *)&local_d50,"-5",
                                                                         (allocator *)&local_1a38);
                                                              BigNumber::BigNumber(&d,&local_d50);
                                                              BigNumber::pow(&c,__x_05,in_XMM1_Qa);
                                                              BigNumber::getString_abi_cxx11_
                                                                        (&a._numberString,&c);
                                                              bVar1 = std::operator==(&a.
                                                  _numberString,"25");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string((string *)&a);
                                                    std::__cxx11::string::~string((string *)&c);
                                                    std::__cxx11::string::~string((string *)&d);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_d50);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_d90,"4",
                                                               (allocator *)&c);
                                                    BigNumber::BigNumber(&local_d70,&local_d90);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_db0,"4",
                                                               (allocator *)&d);
                                                    BigNumber::BigNumber(&a,&local_db0);
                                                    bVar1 = operator==(&local_d70,&a);
                                                    if (bVar1) {
                                                      std::__cxx11::string::~string((string *)&a);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_db0);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_d70);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_d90);
                                                      std::__cxx11::string::string
                                                                ((string *)&local_df0,"-3",
                                                                 (allocator *)&c);
                                                      BigNumber::BigNumber(&local_dd0,&local_df0);
                                                      std::__cxx11::string::string
                                                                ((string *)&local_e10,"-3",
                                                                 (allocator *)&d);
                                                      BigNumber::BigNumber(&a,&local_e10);
                                                      bVar1 = operator==(&local_dd0,&a);
                                                      if (bVar1) {
                                                        std::__cxx11::string::~string((string *)&a);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_e10);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_dd0);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_df0);
                                                        std::__cxx11::string::string
                                                                  ((string *)&local_e50,"0",
                                                                   (allocator *)&c);
                                                        BigNumber::BigNumber(&local_e30,&local_e50);
                                                        std::__cxx11::string::string
                                                                  ((string *)&local_e70,"0",
                                                                   (allocator *)&d);
                                                        BigNumber::BigNumber(&a,&local_e70);
                                                        bVar1 = operator==(&local_e30,&a);
                                                        if (bVar1) {
                                                          std::__cxx11::string::~string
                                                                    ((string *)&a);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_e70);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_e30);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_e50);
                                                          std::__cxx11::string::string
                                                                    ((string *)&local_eb0,
                                                                     "938283828178273",
                                                                     (allocator *)&c);
                                                          BigNumber::BigNumber
                                                                    (&local_e90,&local_eb0);
                                                          std::__cxx11::string::string
                                                                    ((string *)&local_ed0,
                                                                     "938283828178273",
                                                                     (allocator *)&d);
                                                          BigNumber::BigNumber(&a,&local_ed0);
                                                          bVar1 = operator==(&local_e90,&a);
                                                          if (bVar1) {
                                                            std::__cxx11::string::~string
                                                                      ((string *)&a);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_ed0);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_e90);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_eb0);
                                                            std::__cxx11::string::string
                                                                      ((string *)&local_f10,"5",
                                                                       (allocator *)&c);
                                                            BigNumber::BigNumber
                                                                      (&local_ef0,&local_f10);
                                                            std::__cxx11::string::string
                                                                      ((string *)&local_f30,"2",
                                                                       (allocator *)&d);
                                                            BigNumber::BigNumber(&a,&local_f30);
                                                            bVar1 = operator>(&local_ef0,&a);
                                                            if (bVar1) {
                                                              std::__cxx11::string::~string
                                                                        ((string *)&a);
                                                              std::__cxx11::string::~string
                                                                        ((string *)&local_f30);
                                                              std::__cxx11::string::~string
                                                                        ((string *)&local_ef0);
                                                              std::__cxx11::string::~string
                                                                        ((string *)&local_f10);
                                                              std::__cxx11::string::string
                                                                        ((string *)&local_f70,"30",
                                                                         (allocator *)&c);
                                                              BigNumber::BigNumber
                                                                        (&local_f50,&local_f70);
                                                              std::__cxx11::string::string
                                                                        ((string *)&local_f90,"-40",
                                                                         (allocator *)&d);
                                                              BigNumber::BigNumber(&a,&local_f90);
                                                              bVar1 = operator>(&local_f50,&a);
                                                              if (bVar1) {
                                                                std::__cxx11::string::~string
                                                                          ((string *)&a);
                                                                std::__cxx11::string::~string
                                                                          ((string *)&local_f90);
                                                                std::__cxx11::string::~string
                                                                          ((string *)&local_f50);
                                                                std::__cxx11::string::~string
                                                                          ((string *)&local_f70);
                                                                std::__cxx11::string::string
                                                                          ((string *)&local_fd0,"-5"
                                                                           ,(allocator *)&c);
                                                                BigNumber::BigNumber
                                                                          (&local_fb0,&local_fd0);
                                                                std::__cxx11::string::string
                                                                          ((string *)&local_ff0,
                                                                           "-10",(allocator *)&d);
                                                                BigNumber::BigNumber(&a,&local_ff0);
                                                                bVar1 = operator>(&local_fb0,&a);
                                                                if (bVar1) {
                                                                  std::__cxx11::string::~string
                                                                            ((string *)&a);
                                                                  std::__cxx11::string::~string
                                                                            ((string *)&local_ff0);
                                                                  std::__cxx11::string::~string
                                                                            ((string *)&local_fb0);
                                                                  std::__cxx11::string::~string
                                                                            ((string *)&local_fd0);
                                                                  std::__cxx11::string::string
                                                                            ((string *)&local_1030,
                                                                             "0",(allocator *)&c);
                                                                  BigNumber::BigNumber
                                                                            (&local_1010,&local_1030
                                                                            );
                                                                  std::__cxx11::string::string
                                                                            ((string *)&local_1050,
                                                                             "-1",(allocator *)&d);
                                                                  BigNumber::BigNumber
                                                                            (&a,&local_1050);
                                                                  bVar1 = operator>(&local_1010,&a);
                                                                  if (bVar1) {
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&a);
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&local_1050
                                                                              );
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&local_1010
                                                                              );
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&local_1030
                                                                              );
                                                                    std::__cxx11::string::string
                                                                              ((string *)&local_1090
                                                                               ,"10",(allocator *)&c
                                                                              );
                                                                    BigNumber::BigNumber
                                                                              (&local_1070,
                                                                               &local_1090);
                                                                    std::__cxx11::string::string
                                                                              ((string *)&local_10b0
                                                                               ,"20",(allocator *)&d
                                                                              );
                                                                    BigNumber::BigNumber
                                                                              (&a,&local_10b0);
                                                                    bVar1 = operator<(&local_1070,&a
                                                                                     );
                                                                    if (bVar1) {
                                                                      std::__cxx11::string::~string
                                                                                ((string *)&a);
                                                                      std::__cxx11::string::~string
                                                                                ((string *)
                                                                                 &local_10b0);
                                                                      std::__cxx11::string::~string
                                                                                ((string *)
                                                                                 &local_1070);
                                                                      std::__cxx11::string::~string
                                                                                ((string *)
                                                                                 &local_1090);
                                                                      std::__cxx11::string::string
                                                                                ((string *)
                                                                                 &local_10f0,"-5",
                                                                                 (allocator *)&c);
                                                                      BigNumber::BigNumber
                                                                                (&local_10d0,
                                                                                 &local_10f0);
                                                                      std::__cxx11::string::string
                                                                                ((string *)
                                                                                 &local_1110,"0",
                                                                                 (allocator *)&d);
                                                                      BigNumber::BigNumber
                                                                                (&a,&local_1110);
                                                                      bVar1 = operator<(&local_10d0,
                                                                                        &a);
                                                                      if (bVar1) {
                                                                        std::__cxx11::string::
                                                                        ~string((string *)&a);
                                                                        std::__cxx11::string::
                                                                        ~string((string *)
                                                                                &local_1110);
                                                                        std::__cxx11::string::
                                                                        ~string((string *)
                                                                                &local_10d0);
                                                                        std::__cxx11::string::
                                                                        ~string((string *)
                                                                                &local_10f0);
                                                                        std::__cxx11::string::string
                                                                                  ((string *)
                                                                                   &local_1150,"30",
                                                                                   (allocator *)&c);
                                                                        BigNumber::BigNumber
                                                                                  (&local_1130,
                                                                                   &local_1150);
                                                                        std::__cxx11::string::string
                                                                                  ((string *)
                                                                                   &local_1170,
                                                                                   "30000",(
                                                  allocator *)&d);
                                                  BigNumber::BigNumber(&a,&local_1170);
                                                  bVar1 = operator<(&local_1130,&a);
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string((string *)&a);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1170);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1130);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1150);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_11b0,"5",
                                                               (allocator *)&c);
                                                    BigNumber::BigNumber(&local_1190,&local_11b0);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_11d0,"0",
                                                               (allocator *)&d);
                                                    BigNumber::BigNumber(&a,&local_11d0);
                                                    bVar1 = operator>=(&local_1190,&a);
                                                    if (bVar1) {
                                                      std::__cxx11::string::~string((string *)&a);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_11d0);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_1190);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_11b0);
                                                      std::__cxx11::string::string
                                                                ((string *)&local_1210,"-5",
                                                                 (allocator *)&c);
                                                      BigNumber::BigNumber(&local_11f0,&local_1210);
                                                      std::__cxx11::string::string
                                                                ((string *)&local_1230,"-5",
                                                                 (allocator *)&d);
                                                      BigNumber::BigNumber(&a,&local_1230);
                                                      bVar1 = operator>=(&local_11f0,&a);
                                                      if (bVar1) {
                                                        std::__cxx11::string::~string((string *)&a);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_1230);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_11f0);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_1210);
                                                        std::__cxx11::string::string
                                                                  ((string *)&local_1270,"-5",
                                                                   (allocator *)&c);
                                                        BigNumber::BigNumber
                                                                  (&local_1250,&local_1270);
                                                        std::__cxx11::string::string
                                                                  ((string *)&local_1290,"-10",
                                                                   (allocator *)&d);
                                                        BigNumber::BigNumber(&a,&local_1290);
                                                        bVar1 = operator>=(&local_1250,&a);
                                                        if (bVar1) {
                                                          std::__cxx11::string::~string
                                                                    ((string *)&a);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_1290);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_1250);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_1270);
                                                          std::__cxx11::string::string
                                                                    ((string *)&local_12d0,"0",
                                                                     (allocator *)&c);
                                                          BigNumber::BigNumber
                                                                    (&local_12b0,&local_12d0);
                                                          std::__cxx11::string::string
                                                                    ((string *)&local_12f0,"0",
                                                                     (allocator *)&d);
                                                          BigNumber::BigNumber(&a,&local_12f0);
                                                          bVar1 = operator>=(&local_12b0,&a);
                                                          if (bVar1) {
                                                            std::__cxx11::string::~string
                                                                      ((string *)&a);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_12f0);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_12b0);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_12d0);
                                                            std::__cxx11::string::string
                                                                      ((string *)&local_1330,"32",
                                                                       (allocator *)&c);
                                                            BigNumber::BigNumber
                                                                      (&local_1310,&local_1330);
                                                            std::__cxx11::string::string
                                                                      ((string *)&local_1350,"-32",
                                                                       (allocator *)&d);
                                                            BigNumber::BigNumber(&a,&local_1350);
                                                            bVar1 = operator>=(&local_1310,&a);
                                                            if (bVar1) {
                                                              std::__cxx11::string::~string
                                                                        ((string *)&a);
                                                              std::__cxx11::string::~string
                                                                        ((string *)&local_1350);
                                                              std::__cxx11::string::~string
                                                                        ((string *)&local_1310);
                                                              std::__cxx11::string::~string
                                                                        ((string *)&local_1330);
                                                              std::__cxx11::string::string
                                                                        ((string *)&local_1390,"2",
                                                                         (allocator *)&c);
                                                              BigNumber::BigNumber
                                                                        (&local_1370,&local_1390);
                                                              std::__cxx11::string::string
                                                                        ((string *)&local_13b0,
                                                                         "0001",(allocator *)&d);
                                                              BigNumber::BigNumber(&a,&local_13b0);
                                                              bVar1 = operator>=(&local_1370,&a);
                                                              if (bVar1) {
                                                                std::__cxx11::string::~string
                                                                          ((string *)&a);
                                                                std::__cxx11::string::~string
                                                                          ((string *)&local_13b0);
                                                                std::__cxx11::string::~string
                                                                          ((string *)&local_1370);
                                                                std::__cxx11::string::~string
                                                                          ((string *)&local_1390);
                                                                std::__cxx11::string::string
                                                                          ((string *)&local_13f0,"5"
                                                                           ,(allocator *)&c);
                                                                BigNumber::BigNumber
                                                                          (&local_13d0,&local_13f0);
                                                                std::__cxx11::string::string
                                                                          ((string *)&local_1410,
                                                                           "10",(allocator *)&d);
                                                                BigNumber::BigNumber(&a,&local_1410)
                                                                ;
                                                                bVar1 = operator<=(&local_13d0,&a);
                                                                if (bVar1) {
                                                                  std::__cxx11::string::~string
                                                                            ((string *)&a);
                                                                  std::__cxx11::string::~string
                                                                            ((string *)&local_1410);
                                                                  std::__cxx11::string::~string
                                                                            ((string *)&local_13d0);
                                                                  std::__cxx11::string::~string
                                                                            ((string *)&local_13f0);
                                                                  std::__cxx11::string::string
                                                                            ((string *)&local_1450,
                                                                             "0",(allocator *)&c);
                                                                  BigNumber::BigNumber
                                                                            (&local_1430,&local_1450
                                                                            );
                                                                  std::__cxx11::string::string
                                                                            ((string *)&local_1470,
                                                                             "0",(allocator *)&d);
                                                                  BigNumber::BigNumber
                                                                            (&a,&local_1470);
                                                                  bVar1 = operator<=(&local_1430,&a)
                                                                  ;
                                                                  if (bVar1) {
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&a);
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&local_1470
                                                                              );
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&local_1430
                                                                              );
                                                                    std::__cxx11::string::~string
                                                                              ((string *)&local_1450
                                                                              );
                                                                    std::__cxx11::string::string
                                                                              ((string *)&local_14b0
                                                                               ,"-5",(allocator *)&c
                                                                              );
                                                                    BigNumber::BigNumber
                                                                              (&local_1490,
                                                                               &local_14b0);
                                                                    std::__cxx11::string::string
                                                                              ((string *)&local_14d0
                                                                               ,"0",(allocator *)&d)
                                                                    ;
                                                                    BigNumber::BigNumber
                                                                              (&a,&local_14d0);
                                                                    bVar1 = operator<=(&local_1490,
                                                                                       &a);
                                                                    if (bVar1) {
                                                                      std::__cxx11::string::~string
                                                                                ((string *)&a);
                                                                      std::__cxx11::string::~string
                                                                                ((string *)
                                                                                 &local_14d0);
                                                                      std::__cxx11::string::~string
                                                                                ((string *)
                                                                                 &local_1490);
                                                                      std::__cxx11::string::~string
                                                                                ((string *)
                                                                                 &local_14b0);
                                                                      std::__cxx11::string::string
                                                                                ((string *)
                                                                                 &local_1510,"30",
                                                                                 (allocator *)&c);
                                                                      BigNumber::BigNumber
                                                                                (&local_14f0,
                                                                                 &local_1510);
                                                                      std::__cxx11::string::string
                                                                                ((string *)
                                                                                 &local_1530,"30",
                                                                                 (allocator *)&d);
                                                                      BigNumber::BigNumber
                                                                                (&a,&local_1530);
                                                                      bVar1 = operator<=(&local_14f0
                                                                                         ,&a);
                                                                      if (bVar1) {
                                                                        std::__cxx11::string::
                                                                        ~string((string *)&a);
                                                                        std::__cxx11::string::
                                                                        ~string((string *)
                                                                                &local_1530);
                                                                        std::__cxx11::string::
                                                                        ~string((string *)
                                                                                &local_14f0);
                                                                        std::__cxx11::string::
                                                                        ~string((string *)
                                                                                &local_1510);
                                                                        std::__cxx11::string::string
                                                                                  ((string *)
                                                                                   &local_1570,"400"
                                                                                   ,(allocator *)&c)
                                                                        ;
                                                                        BigNumber::BigNumber
                                                                                  (&local_1550,
                                                                                   &local_1570);
                                                                        std::__cxx11::string::string
                                                                                  ((string *)
                                                                                   &local_1590,
                                                                                   "392342",(
                                                  allocator *)&d);
                                                  BigNumber::BigNumber(&a,&local_1590);
                                                  bVar1 = operator<=(&local_1550,&a);
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string((string *)&a);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1590);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1550);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1570);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_15b0,"423",
                                                               (allocator *)&c);
                                                    BigNumber::BigNumber(&a,&local_15b0);
                                                    uVar2 = BigNumber::operator[](&a,1);
                                                    if (uVar2 == 2) {
                                                      std::__cxx11::string::~string((string *)&a);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_15b0);
                                                      std::__cxx11::string::string
                                                                ((string *)&local_15d0,"0",
                                                                 (allocator *)&c);
                                                      BigNumber::BigNumber(&a,&local_15d0);
                                                      uVar2 = BigNumber::operator[](&a,0);
                                                      if (uVar2 == 0) {
                                                        std::__cxx11::string::~string((string *)&a);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_15d0);
                                                        std::__cxx11::string::string
                                                                  ((string *)&local_15f0,"-5",
                                                                   (allocator *)&c);
                                                        BigNumber::BigNumber(&a,&local_15f0);
                                                        uVar2 = BigNumber::operator[](&a,1);
                                                        if (uVar2 == 5) {
                                                          std::__cxx11::string::~string
                                                                    ((string *)&a);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_15f0);
                                                          std::__cxx11::string::string
                                                                    ((string *)&local_1610,"426",
                                                                     (allocator *)&c);
                                                          BigNumber::BigNumber(&a,&local_1610);
                                                          bVar1 = BigNumber::isEven(&a);
                                                          if (!bVar1) {
                                                            __assert_fail(
                                                  "BigNumber(\"426\").isEven()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x81,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&a);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1610);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1630,"-20",
                                                             (allocator *)&c);
                                                  BigNumber::BigNumber(&a,&local_1630);
                                                  bVar1 = BigNumber::isEven(&a);
                                                  if (!bVar1) {
                                                    __assert_fail("BigNumber(\"-20\").isEven()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x82,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&a);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1630);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1650,"83",
                                                             (allocator *)&c);
                                                  BigNumber::BigNumber(&a,&local_1650);
                                                  bVar1 = BigNumber::isOdd(&a);
                                                  if (!bVar1) {
                                                    __assert_fail("BigNumber(\"83\").isOdd()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x85,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&a);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1650);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1670,"-27",
                                                             (allocator *)&c);
                                                  BigNumber::BigNumber(&a,&local_1670);
                                                  bVar1 = BigNumber::isOdd(&a);
                                                  if (!bVar1) {
                                                    __assert_fail("BigNumber(\"-27\").isOdd()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x86,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&a);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1670);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1690,"38",
                                                             (allocator *)&c);
                                                  BigNumber::BigNumber(&a,&local_1690);
                                                  bVar1 = BigNumber::isPositive(&a);
                                                  if (!bVar1) {
                                                    __assert_fail("BigNumber(\"38\").isPositive()",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x89,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&a);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1690);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_16b0,"-28382",
                                                             (allocator *)&c);
                                                  BigNumber::BigNumber(&a,&local_16b0);
                                                  bVar1 = BigNumber::isNegative(&a);
                                                  if (!bVar1) {
                                                    __assert_fail(
                                                  "BigNumber(\"-28382\").isNegative()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x8c,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&a);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_16b0);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_16d0,"5",
                                                             (allocator *)&local_1a38);
                                                  BigNumber::BigNumber(&d,&local_16d0);
                                                  BigNumber::operator--(&c,&d,0);
                                                  BigNumber::getString_abi_cxx11_
                                                            (&a._numberString,&c);
                                                  bVar1 = std::operator==(&a._numberString,"5");
                                                  if (!bVar1) {
                                                    __assert_fail(
                                                  "BigNumber(\"5\")--.getString() == \"5\"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x8f,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&a);
                                                  std::__cxx11::string::~string((string *)&c);
                                                  std::__cxx11::string::~string((string *)&d);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_16d0);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_16f0,"5",
                                                             (allocator *)&d);
                                                  BigNumber::BigNumber(&c,&local_16f0);
                                                  pBVar3 = BigNumber::operator--(&c);
                                                  BigNumber::getString_abi_cxx11_
                                                            (&a._numberString,pBVar3);
                                                  bVar1 = std::operator==(&a._numberString,"4");
                                                  if (!bVar1) {
                                                    __assert_fail(
                                                  "(--BigNumber(\"5\")).getString() == \"4\"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x90,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&a);
                                                  std::__cxx11::string::~string((string *)&c);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_16f0);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1710,"10",
                                                             (allocator *)&local_1a38);
                                                  BigNumber::BigNumber(&d,&local_1710);
                                                  BigNumber::operator++(&c,&d,0);
                                                  BigNumber::getString_abi_cxx11_
                                                            (&a._numberString,&c);
                                                  bVar1 = std::operator==(&a._numberString,"10");
                                                  if (!bVar1) {
                                                    __assert_fail(
                                                  "BigNumber(\"10\")++.getString() == \"10\"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x91,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&a);
                                                  std::__cxx11::string::~string((string *)&c);
                                                  std::__cxx11::string::~string((string *)&d);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1710);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1730,"10",
                                                             (allocator *)&d);
                                                  BigNumber::BigNumber(&c,&local_1730);
                                                  pBVar3 = BigNumber::operator++(&c);
                                                  BigNumber::getString_abi_cxx11_
                                                            (&a._numberString,pBVar3);
                                                  bVar1 = std::operator==(&a._numberString,"11");
                                                  if (!bVar1) {
                                                    __assert_fail(
                                                  "(++BigNumber(\"10\")).getString() == \"11\"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x92,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&a);
                                                  std::__cxx11::string::~string((string *)&c);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1730);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1750,"10",
                                                             (allocator *)&c);
                                                  BigNumber::BigNumber(&a,&local_1750);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1750);
                                                  BigNumber::operator++(&local_30,&a,0);
                                                  std::__cxx11::string::~string((string *)&local_30)
                                                  ;
                                                  BigNumber::getString_abi_cxx11_
                                                            (&c._numberString,&a);
                                                  bVar1 = std::operator==(&c._numberString,"11");
                                                  if (!bVar1) {
                                                    __assert_fail("a.getString() == \"11\"",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x96,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&c);
                                                  BigNumber::operator++(&a);
                                                  BigNumber::getString_abi_cxx11_
                                                            (&c._numberString,&a);
                                                  bVar1 = std::operator==(&c._numberString,"12");
                                                  if (!bVar1) {
                                                    __assert_fail("a.getString() == \"12\"",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x98,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&c);
                                                  BigNumber::operator--(&local_50,&a,0);
                                                  std::__cxx11::string::~string((string *)&local_50)
                                                  ;
                                                  BigNumber::getString_abi_cxx11_
                                                            (&c._numberString,&a);
                                                  bVar1 = std::operator==(&c._numberString,"11");
                                                  if (!bVar1) {
                                                    __assert_fail("a.getString() == \"11\"",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x9a,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&c);
                                                  BigNumber::operator--(&a);
                                                  BigNumber::getString_abi_cxx11_
                                                            (&c._numberString,&a);
                                                  bVar1 = std::operator==(&c._numberString,"10");
                                                  if (!bVar1) {
                                                    __assert_fail("a.getString() == \"10\"",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x9c,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&c);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1770,"45",
                                                             (allocator *)&local_19f0);
                                                  BigNumber::BigNumber
                                                            ((BigNumber *)&local_1a38,&local_1770);
                                                  BigNumber::abs(&d,(int)&local_1a38);
                                                  BigNumber::getString_abi_cxx11_
                                                            (&c._numberString,&d);
                                                  bVar1 = std::operator==(&c._numberString,"45");
                                                  if (!bVar1) {
                                                    __assert_fail(
                                                  "BigNumber(\"45\").abs().getString() == \"45\"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0x9f,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&c);
                                                  std::__cxx11::string::~string((string *)&d);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1a38);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1770);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1790,"-325",
                                                             (allocator *)&local_19f0);
                                                  BigNumber::BigNumber
                                                            ((BigNumber *)&local_1a38,&local_1790);
                                                  BigNumber::abs(&d,(int)&local_1a38);
                                                  BigNumber::getString_abi_cxx11_
                                                            (&c._numberString,&d);
                                                  bVar1 = std::operator==(&c._numberString,"325");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string((string *)&c);
                                                    std::__cxx11::string::~string((string *)&d);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1a38);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1790);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_17b0,"28374765",
                                                               (allocator *)&d);
                                                    BigNumber::BigNumber(&c,&local_17b0);
                                                    uVar2 = BigNumber::digits(&c);
                                                    if (uVar2 != 8) {
                                                      __assert_fail(
                                                  "BigNumber(\"28374765\").digits() == 8",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xa3,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&c);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_17b0);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_17d0,"-3092",
                                                             (allocator *)&d);
                                                  BigNumber::BigNumber(&c,&local_17d0);
                                                  uVar2 = BigNumber::digits(&c);
                                                  if (uVar2 != 4) {
                                                    __assert_fail(
                                                  "BigNumber(\"-3092\").digits() == 4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xa4,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&c);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_17d0);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_17f0,"234",&local_1a11
                                                            );
                                                  BigNumber::BigNumber
                                                            ((BigNumber *)&local_1a38,&local_17f0);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_19f0,"-45",&local_1a12
                                                            );
                                                  BigNumber::setString
                                                            (&d,(BigNumber *)&local_1a38,&local_19f0
                                                            );
                                                  BigNumber::getString_abi_cxx11_
                                                            (&c._numberString,&d);
                                                  bVar1 = std::operator==(&c._numberString,"-45");
                                                  if (!bVar1) {
                                                    __assert_fail(
                                                  "BigNumber(\"234\").setString(\"-45\").getString() == \"-45\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xa7,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&c);
                                                  std::__cxx11::string::~string((string *)&d);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_19f0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1a38);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_17f0);
                                                  BigNumber::BigNumber(&c,10);
                                                  d._numberString._M_dataplus._M_p = (pointer)0x5;
                                                  BigNumber::operator=(&c,(longlong *)&d);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1810,(string *)&c);
                                                  d._numberString._M_dataplus._M_p = (pointer)0x5;
                                                  bVar1 = operator==(&local_1810,(longlong *)&d);
                                                  if (!bVar1) {
                                                    __assert_fail("c == 5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xac,"int main()");
                                                  }
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1810);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1830,(string *)&c);
                                                  BigNumber::BigNumber(&d,5);
                                                  bVar1 = operator==(&local_1830,&d);
                                                  if (!bVar1) {
                                                    __assert_fail("c == BigNumber(5)",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xad,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&d);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1830);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1850,(string *)&c);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1870,"5",
                                                             (allocator *)&local_1a38);
                                                  BigNumber::BigNumber(&d,&local_1870);
                                                  bVar1 = operator==(&local_1850,&d);
                                                  if (!bVar1) {
                                                    __assert_fail("c == BigNumber(\"5\")",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xae,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&d);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1870);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1850);
                                                  std::__cxx11::string::string
                                                            ((string *)&d,"83833",
                                                             (allocator *)&local_1a38);
                                                  BigNumber::operator=(&c,&d._numberString);
                                                  std::__cxx11::string::~string((string *)&d);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1890,(string *)&c);
                                                  d._numberString._M_dataplus._M_p =
                                                       (pointer)0x14779;
                                                  bVar1 = operator==(&local_1890,(longlong *)&d);
                                                  if (!bVar1) {
                                                    __assert_fail("c == 83833",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xb0,"int main()");
                                                  }
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1890);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_18b0,(string *)&c);
                                                  BigNumber::BigNumber(&d,0x14779);
                                                  bVar1 = operator==(&local_18b0,&d);
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string((string *)&d);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_18b0);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_18d0,(string *)&c);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_18f0,"83833",
                                                               (allocator *)&local_1a38);
                                                    BigNumber::BigNumber(&d,&local_18f0);
                                                    bVar1 = operator==(&local_18d0,&d);
                                                    if (!bVar1) {
                                                      __assert_fail("c == BigNumber(\"83833\")",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xb2,"int main()");
                                                  }
                                                  std::__cxx11::string::~string((string *)&d);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_18f0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_18d0);
                                                  BigNumber::BigNumber(&d,0x28);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1910,(string *)&d);
                                                  local_1a38._M_dataplus._M_p = (pointer)0x28;
                                                  bVar1 = operator==(&local_1910,
                                                                     (longlong *)&local_1a38);
                                                  if (!bVar1) {
                                                    __assert_fail("d == 40",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xb6,"int main()");
                                                  }
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1910);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1930,(string *)&d);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1a38,"40",
                                                             (allocator *)&local_19f0);
                                                  bVar1 = operator==(&local_1930,&local_1a38);
                                                  if (!bVar1) {
                                                    __assert_fail("d == \"40\"",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xb7,"int main()");
                                                  }
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1a38);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1930);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1950,(string *)&d);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1970,"40",
                                                             (allocator *)&local_19f0);
                                                  BigNumber::BigNumber
                                                            ((BigNumber *)&local_1a38,&local_1970);
                                                  bVar1 = operator==(&local_1950,
                                                                     (BigNumber *)&local_1a38);
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1a38);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1970);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1950);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_1990,(string *)&d);
                                                    BigNumber::BigNumber
                                                              ((BigNumber *)&local_1a38,0x28);
                                                    bVar1 = operator==(&local_1990,
                                                                       (BigNumber *)&local_1a38);
                                                    if (!bVar1) {
                                                      __assert_fail("d == BigNumber(40)",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xb9,"int main()");
                                                  }
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1a38);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1990);
                                                  local_1a38._M_dataplus._M_p = (pointer)0x28;
                                                  BigNumber::operator=(&d,(longlong *)&local_1a38);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_19b0,(string *)&d);
                                                  local_1a38._M_dataplus._M_p = (pointer)0x28;
                                                  bVar1 = operator==(&local_19b0,
                                                                     (longlong *)&local_1a38);
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_19b0);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_1a38,"40",
                                                               (allocator *)&local_19f0);
                                                    BigNumber::operator=(&d,&local_1a38);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1a38);
                                                    std::__cxx11::string::string
                                                              ((string *)&local_19d0,(string *)&d);
                                                    local_1a38._M_dataplus._M_p = (pointer)0x28;
                                                    bVar1 = operator==(&local_19d0,
                                                                       (longlong *)&local_1a38);
                                                    if (bVar1) {
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_19d0);
                                                      poVar4 = std::operator<<((ostream *)&std::cout
                                                                               ,
                                                  "BigNumber ran successfully.");
                                                  std::endl<char,std::char_traits<char>>(poVar4);
                                                  std::__cxx11::string::~string((string *)&d);
                                                  std::__cxx11::string::~string((string *)&c);
                                                  std::__cxx11::string::~string((string *)&a);
                                                  std::__cxx11::string::~string((string *)&dv1);
                                                  std::__cxx11::string::~string((string *)&ml1);
                                                  std::__cxx11::string::~string((string *)&sb1);
                                                  std::__cxx11::string::~string((string *)&ad1);
                                                  return 0;
                                                  }
                                                  __assert_fail("d == 40",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xbd,"int main()");
                                                  }
                                                  __assert_fail("d == 40",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xbb,"int main()");
                                                  }
                                                  __assert_fail("d == BigNumber(\"40\")",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xb8,"int main()");
                                                  }
                                                  __assert_fail("c == BigNumber(83833)",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xb1,"int main()");
                                                  }
                                                  __assert_fail(
                                                  "BigNumber(\"-325\").abs().getString() == \"325\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                                                  ,0xa0,"int main()");
                                                  }
                                                  __assertion = "BigNumber(\"-5\")[1] == 5";
                                                  uVar2 = 0x7e;
                                                  }
                                                  else {
                                                    __assertion = "BigNumber(\"0\")[0] == 0";
                                                    uVar2 = 0x7d;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "BigNumber(\"423\")[1] == 2";
                                                    uVar2 = 0x7c;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"400\") <= BigNumber(\"392342\")";
                                                  uVar2 = 0x79;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"30\") <= BigNumber(\"30\")";
                                                  uVar2 = 0x78;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"-5\") <= BigNumber(\"0\")";
                                                  uVar2 = 0x77;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"0\") <= BigNumber(\"0\")";
                                                  uVar2 = 0x76;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"5\") <= BigNumber(\"10\")";
                                                  uVar2 = 0x75;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"2\") >= BigNumber(\"0001\")";
                                                  uVar2 = 0x72;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"32\") >= BigNumber(\"-32\")";
                                                  uVar2 = 0x71;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"0\") >= BigNumber(\"0\")";
                                                  uVar2 = 0x70;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"-5\") >= BigNumber(\"-10\")";
                                                  uVar2 = 0x6f;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"-5\") >= BigNumber(\"-5\")";
                                                  uVar2 = 0x6e;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"5\") >= BigNumber(\"0\")";
                                                  uVar2 = 0x6d;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"30\") < BigNumber(\"30000\")";
                                                  uVar2 = 0x6a;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"-5\") < BigNumber(\"0\")";
                                                  uVar2 = 0x69;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"10\") < BigNumber(\"20\")";
                                                  uVar2 = 0x68;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"0\") > BigNumber(\"-1\")";
                                                  uVar2 = 0x65;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"-5\") > BigNumber(\"-10\")";
                                                  uVar2 = 100;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"30\") > BigNumber(\"-40\")";
                                                  uVar2 = 99;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"5\") > BigNumber(\"2\")";
                                                  uVar2 = 0x62;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"938283828178273\") == BigNumber(\"938283828178273\")"
                                                  ;
                                                  uVar2 = 0x5f;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"0\") == BigNumber(\"0\")";
                                                  uVar2 = 0x5e;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"-3\") == BigNumber(\"-3\")";
                                                  uVar2 = 0x5d;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"4\") == BigNumber(\"4\")";
                                                  uVar2 = 0x5c;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "(BigNumber(\"-5\").pow(2)).getString() == \"25\""
                                                  ;
                                                  uVar2 = 0x59;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "(BigNumber(\"5\").pow(0)).getString() == \"1\"";
                                                  uVar2 = 0x58;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "(BigNumber(\"5\").pow(1)).getString() == \"5\"";
                                                  uVar2 = 0x57;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "(BigNumber(\"10\").pow(10)).getString() == \"10000000000\""
                                                  ;
                                                  uVar2 = 0x56;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "(BigNumber(\"5\").pow(2)).getString() == \"25\"";
                                                  uVar2 = 0x55;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "(BigNumber(\"1\").pow(38)).getString() == \"1\"";
                                                  uVar2 = 0x54;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "(BigNumber(\"2\").pow(3)).getString() == \"8\"";
                                                  uVar2 = 0x53;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "dv1 == \"5097\"";
                                                    uVar2 = 0x50;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "dv1 == 10";
                                                    uVar2 = 0x4d;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "dv1 == -1";
                                                    uVar2 = 0x4a;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "dv1 == 1";
                                                    uVar2 = 0x47;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "dv1 == 1";
                                                    uVar2 = 0x45;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "dv1 == 4";
                                                    uVar2 = 0x43;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"100\").divide(BigNumber(\"5\")) == 20"
                                                  ;
                                                  uVar2 = 0x40;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"48\").divide(BigNumber(\"6\")) == 8";
                                                  uVar2 = 0x3f;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "BigNumber(\"25\").divide(BigNumber(\"5\")) == 5";
                                                  uVar2 = 0x3e;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "ml1 == 150000";
                                                    uVar2 = 0x3b;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "ml1 == 30";
                                                    uVar2 = 0x39;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "ml1 == \"24\"";
                                                    uVar2 = 0x37;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "(BigNumber(\"283\") * BigNumber(\"382871\")).getString() == \"108352493\""
                                                  ;
                                                  uVar2 = 0x34;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "(BigNumber(\"-33\") * BigNumber(\"-2\")).getString() == \"66\""
                                                  ;
                                                  uVar2 = 0x33;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "(BigNumber(\"-5\") * BigNumber(\"5\")).getString() == \"-25\""
                                                  ;
                                                  uVar2 = 0x32;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "(BigNumber(\"99\") * BigNumber(\"0\")).getString() == \"0\""
                                                  ;
                                                  uVar2 = 0x31;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "(BigNumber(\"3002\") * BigNumber(\"1\")).getString() == \"3002\""
                                                  ;
                                                  uVar2 = 0x30;
                                                  }
                                                }
                                                else {
                                                  __assertion = 
                                                  "(BigNumber(\"4\") * BigNumber(\"12\")).getString() == \"48\""
                                                  ;
                                                  uVar2 = 0x2f;
                                                }
                                              }
                                              else {
                                                __assertion = "sb1 == BigNumber(-40)";
                                                uVar2 = 0x2c;
                                              }
                                            }
                                            else {
                                              __assertion = "sb1 == \"-20\"";
                                              uVar2 = 0x2a;
                                            }
                                          }
                                          else {
                                            __assertion = "sb1 == 160";
                                            uVar2 = 0x28;
                                          }
                                        }
                                        else {
                                          __assertion = 
                                          "(BigNumber(\"-100\") - BigNumber(\"-5\")) == -95";
                                          uVar2 = 0x25;
                                        }
                                      }
                                      else {
                                        __assertion = 
                                        "(BigNumber(\"100\") - BigNumber(\"5\")) == 95";
                                        uVar2 = 0x24;
                                      }
                                    }
                                    else {
                                      __assertion = 
                                      "(BigNumber(\"42\") - BigNumber(\"49\")).getString() == \"-7\""
                                      ;
                                      uVar2 = 0x23;
                                    }
                                  }
                                  else {
                                    __assertion = 
                                    "(BigNumber(\"100\") - BigNumber(\"50\")).getString() == \"50\""
                                    ;
                                    uVar2 = 0x22;
                                  }
                                }
                                else {
                                  __assertion = 
                                  "(BigNumber(\"6828\") - BigNumber(\"1\")).getString() == \"6827\""
                                  ;
                                  uVar2 = 0x21;
                                }
                              }
                              else {
                                __assertion = 
                                "(BigNumber(\"482847\") - BigNumber(\"89787941\")).getString() == \"-89305094\""
                                ;
                                uVar2 = 0x20;
                              }
                            }
                            else {
                              __assertion = 
                              "(BigNumber(\"50\") - BigNumber(\"50\")).getString() == \"0\"";
                              uVar2 = 0x1f;
                            }
                          }
                          else {
                            __assertion = 
                            "(BigNumber(\"0\") - BigNumber(\"46\")).getString() == \"-46\"";
                            uVar2 = 0x1e;
                          }
                        }
                        else {
                          __assertion = 
                          "(BigNumber(\"50\") - BigNumber(\"60\")).getString() == \"-10\"";
                          uVar2 = 0x1d;
                        }
                      }
                      else {
                        __assertion = 
                        "(BigNumber(\"50\") - BigNumber(\"32\")).getString() == \"18\"";
                        uVar2 = 0x1c;
                      }
                    }
                    else {
                      __assertion = "ad1 == 700";
                      uVar2 = 0x19;
                    }
                  }
                  else {
                    __assertion = "ad1.getString() == \"700\"";
                    uVar2 = 0x18;
                  }
                }
                else {
                  __assertion = "BigNumber(\"-41\") + 40 == -1";
                  uVar2 = 0x14;
                }
              }
              else {
                __assertion = "BigNumber(5) + 10 == 15";
                uVar2 = 0x13;
              }
            }
            else {
              __assertion = "(BigNumber(\"0\") + BigNumber(\"0\")).getString() == \"0\"";
              uVar2 = 0x12;
            }
          }
          else {
            __assertion = "(BigNumber(\"126\") + BigNumber(\"39285\")).getString() == \"39411\"";
            uVar2 = 0x11;
          }
        }
        else {
          __assertion = "(BigNumber(\"15535\") + BigNumber(\"0\")).getString() == \"15535\"";
          uVar2 = 0x10;
        }
      }
      else {
        __assertion = "(BigNumber(\"-33\") + BigNumber(\"8\")).getString() == \"-25\"";
        uVar2 = 0xf;
      }
    }
    else {
      __assertion = "(BigNumber(5) + BigNumber(622)).getString() == \"627\"";
      uVar2 = 0xe;
    }
  }
  else {
    __assertion = "(BigNumber(50) + BigNumber(32)).getString() == \"82\"";
    uVar2 = 0xd;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                uVar2,"int main()");
}

Assistant:

int main() {
    //Addition
    assert((BigNumber(50) + BigNumber(32)).getString() == "82");
    assert((BigNumber(5) + BigNumber(622)).getString() == "627");
    assert((BigNumber("-33") + BigNumber("8")).getString() == "-25");
    assert((BigNumber("15535") + BigNumber("0")).getString() == "15535");
    assert((BigNumber("126") + BigNumber("39285")).getString() == "39411");
    assert((BigNumber("0") + BigNumber("0")).getString() == "0");
    assert(BigNumber(5) + 10 == 15);
    assert(BigNumber("-41") + 40 == -1);
    BigNumber ad1(600);
    ad1 += 50;
    ad1 += "50";
    assert(ad1.getString() == "700");
    assert(ad1 == 700);

    //Subtraction
    assert((BigNumber("50") - BigNumber("32")).getString() == "18");
    assert((BigNumber("50") - BigNumber("60")).getString() == "-10");
    assert((BigNumber("0") - BigNumber("46")).getString() == "-46");
    assert((BigNumber("50") - BigNumber("50")).getString() == "0");
    assert((BigNumber("482847") - BigNumber("89787941")).getString() == "-89305094");
    assert((BigNumber("6828") - BigNumber("1")).getString() == "6827");
    assert((BigNumber("100") - BigNumber("50")).getString() == "50");
    assert((BigNumber("42") - BigNumber("49")).getString() == "-7");
    assert((BigNumber("100") - BigNumber("5")) == 95);
    assert((BigNumber("-100") - BigNumber("-5")) == -95);
    BigNumber sb1 = 200;
    sb1 -= 40;
    assert(sb1 == 160);
    sb1 = sb1 - 180;
    assert(sb1 == "-20");
    sb1 -= "20";
    assert(sb1 == BigNumber(-40));

    //Multiplication
    assert((BigNumber("4") * BigNumber("12")).getString() == "48");
    assert((BigNumber("3002") * BigNumber("1")).getString() == "3002");
    assert((BigNumber("99") * BigNumber("0")).getString() == "0");
    assert((BigNumber("-5") * BigNumber("5")).getString() == "-25");
    assert((BigNumber("-33") * BigNumber("-2")).getString() == "66");
    assert((BigNumber("283") * BigNumber("382871")).getString() == "108352493");
    BigNumber ml1 = 4;
    ml1 *= 6;
    assert(ml1 == "24");
    ml1 = BigNumber(5) * 6;
    assert(ml1 == 30);
    ml1 *= "5000";
    assert(ml1 == 150000);

    //Division
    assert(BigNumber("25").divide(BigNumber("5")) == 5);
    assert(BigNumber("48").divide(BigNumber("6")) == 8);
    assert(BigNumber("100").divide(BigNumber("5")) == 20);
    BigNumber dv1 = 100;
    dv1 /= 25;
    assert(dv1 == 4);
    dv1 = dv1 / dv1;
    assert(dv1 == 1);
    dv1 /= 1;
    assert(dv1 == 1);
    dv1 = -5;
    dv1 /= 5;
    assert(dv1 == -1);
    dv1 = 3000;
    dv1 /= 300;
    assert(dv1 == 10);
    dv1 = 25485;
    dv1 /= 5;
    assert(dv1 == "5097");

    //Exponentiation
    assert((BigNumber("2").pow(3)).getString() == "8");
    assert((BigNumber("1").pow(38)).getString() == "1");
    assert((BigNumber("5").pow(2)).getString() == "25");
    assert((BigNumber("10").pow(10)).getString() == "10000000000");
    assert((BigNumber("5").pow(1)).getString() == "5");
    assert((BigNumber("5").pow(0)).getString() == "1");
    assert((BigNumber("-5").pow(2)).getString() == "25");

    //Equals
    assert(BigNumber("4") == BigNumber("4"));
    assert(BigNumber("-3") == BigNumber("-3"));
    assert(BigNumber("0") == BigNumber("0"));
    assert(BigNumber("938283828178273") == BigNumber("938283828178273"));

    //Greater than
    assert(BigNumber("5") > BigNumber("2"));
    assert(BigNumber("30") > BigNumber("-40"));
    assert(BigNumber("-5") > BigNumber("-10"));
    assert(BigNumber("0") > BigNumber("-1"));

    //Less than
    assert(BigNumber("10") < BigNumber("20"));
    assert(BigNumber("-5") < BigNumber("0"));
    assert(BigNumber("30") < BigNumber("30000"));

    //Greater than or equal to
    assert(BigNumber("5") >= BigNumber("0"));
    assert(BigNumber("-5") >= BigNumber("-5"));
    assert(BigNumber("-5") >= BigNumber("-10"));
    assert(BigNumber("0") >= BigNumber("0"));
    assert(BigNumber("32") >= BigNumber("-32"));
    assert(BigNumber("2") >= BigNumber("0001"));

    //Less than or equal to
    assert(BigNumber("5") <= BigNumber("10"));
    assert(BigNumber("0") <= BigNumber("0"));
    assert(BigNumber("-5") <= BigNumber("0"));
    assert(BigNumber("30") <= BigNumber("30"));
    assert(BigNumber("400") <= BigNumber("392342"));

    //Index
    assert(BigNumber("423")[1] == 2);
    assert(BigNumber("0")[0] == 0);
    assert(BigNumber("-5")[1] == 5);

    //Even
    assert(BigNumber("426").isEven());
    assert(BigNumber("-20").isEven());

    //Odd
    assert(BigNumber("83").isOdd());
    assert(BigNumber("-27").isOdd());

    //Positive
    assert(BigNumber("38").isPositive());

    //Negative
    assert(BigNumber("-28382").isNegative());

    //Increment/Decrement operators
    assert(BigNumber("5")--.getString() == "5");
    assert((--BigNumber("5")).getString() == "4");
    assert(BigNumber("10")++.getString() == "10");
    assert((++BigNumber("10")).getString() == "11");

    BigNumber a("10");
    a++;
    assert(a.getString() == "11");
    ++a;
    assert(a.getString() == "12");
    a--;
    assert(a.getString() == "11");
    --a;
    assert(a.getString() == "10");

    //Absolute value
    assert(BigNumber("45").abs().getString() == "45");
    assert(BigNumber("-325").abs().getString() == "325");

    //Digits
    assert(BigNumber("28374765").digits() == 8);
    assert(BigNumber("-3092").digits() == 4);

    //Set string
    assert(BigNumber("234").setString("-45").getString() == "-45");

    //Assignment operator
    BigNumber c(10);
    c = 5;
    assert(c == 5);
    assert(c == BigNumber(5));
    assert(c == BigNumber("5"));
    c = "83833";
    assert(c == 83833);
    assert(c == BigNumber(83833));
    assert(c == BigNumber("83833"));

    //Equals testing
    BigNumber d(40);
    assert(d == 40);
    assert(d == "40");
    assert(d == BigNumber("40"));
    assert(d == BigNumber(40));
    d = 40;
    assert(d == 40);
    d = "40";
    assert(d == 40);


    std::cout << "BigNumber ran successfully." << std::endl;
}